

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void boost::detail::sp_pointer_construct<PartialPolicyPoolItemInterface,PartialJPDPValuePair>
               (shared_ptr<PartialPolicyPoolItemInterface> *ppx,PartialJPDPValuePair *p,
               shared_count *pn)

{
  sp_counted_base *psVar1;
  sp_counted_base *in_RAX;
  shared_count local_18;
  
  local_18.pi_ = in_RAX;
  shared_count::shared_count<PartialJPDPValuePair>(&local_18,p);
  psVar1 = pn->pi_;
  pn->pi_ = (sp_counted_base *)local_18;
  local_18.pi_ = psVar1;
  shared_count::~shared_count(&local_18);
  return;
}

Assistant:

inline void sp_pointer_construct( boost::shared_ptr< T > * ppx, Y * p, boost::detail::shared_count & pn )
{
    boost::detail::shared_count( p ).swap( pn );
    boost::detail::sp_enable_shared_from_this( ppx, p, p );
}